

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  ImGuiContext *pIVar1;
  ImDrawList *draw_list;
  int in_ESI;
  long in_RDI;
  float fVar2;
  float fVar3;
  ImGuiContext *g;
  ImGuiContext *g_1;
  float start_x;
  ImGuiWindow *window;
  ImGuiTableColumn *column;
  char *in_stack_00000050;
  char *in_stack_00000058;
  ImVec2 *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffd8;
  ImGuiWindow *window_00;
  undefined4 in_stack_fffffffffffffff0;
  
  draw_list = (ImDrawList *)
              ImSpan<ImGuiTableColumn>::operator[]
                        ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_ESI);
  window_00 = *(ImGuiWindow **)(in_RDI + 0x188);
  *(int *)(in_RDI + 0x7c) = in_ESI;
  fVar2 = (float)draw_list->_VtxCurrentIdx;
  if (((draw_list->CmdBuffer).Size & 0x10000U) != 0) {
    fVar2 = *(float *)(in_RDI + 0x94) + fVar2;
  }
  (window_00->DC).CursorPos.x = fVar2;
  (window_00->DC).CursorPos.y = *(float *)(in_RDI + 0x84) + *(float *)(in_RDI + 200);
  (window_00->DC).CursorMaxPos.x = (window_00->DC).CursorPos.x;
  (window_00->DC).ColumnsOffset.x = (fVar2 - (window_00->Pos).x) - (window_00->DC).Indent.x;
  (window_00->DC).CurrLineTextBaseOffset = *(float *)(in_RDI + 0x90);
  (window_00->DC).NavLayerCurrent = (int)*(ImS8 *)((long)&(draw_list->_ClipRectStack).Data + 2);
  (window_00->WorkRect).Min.y = (window_00->DC).CursorPos.y;
  (window_00->WorkRect).Min.x = (float)draw_list->_VtxCurrentIdx;
  (window_00->WorkRect).Max.x = *(float *)&draw_list->_Data;
  (window_00->DC).ItemWidth = *(float *)((long)&draw_list->_Data + 4);
  if (((draw_list->_ClipRectStack).Size & 0x10000) == 0) {
    fVar3 = ImMax<float>((window_00->DC).CursorPos.y,*(float *)(in_RDI + 0x88));
    (window_00->DC).CursorPos.y = fVar3;
  }
  window_00->SkipItems = (bool)(*(byte *)&(draw_list->_ClipRectStack).Data & 1);
  pIVar1 = GImGui;
  if (((ulong)(draw_list->_ClipRectStack).Data & 1) != 0) {
    (GImGui->LastItemData).ID = 0;
    (pIVar1->LastItemData).StatusFlags = 0;
  }
  if ((*(uint *)(in_RDI + 4) & 0x100000) == 0) {
    SetWindowClipRectBeforeSetChannel(window_00,(ImRect *)CONCAT44(fVar2,in_stack_ffffffffffffffd8))
    ;
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),draw_list,
               (int)((ulong)window_00 >> 0x20));
  }
  else {
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),draw_list,
               (int)((ulong)window_00 >> 0x20));
  }
  pIVar1 = GImGui;
  if (((GImGui->LogEnabled & 1U) != 0) && (((ulong)(draw_list->_ClipRectStack).Data & 1) == 0)) {
    LogRenderedText(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    pIVar1->LogLinePosY = 3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::TableBeginCell(ImGuiTable* table, int column_n)
{
    ImGuiTableColumn* column = &table->Columns[column_n];
    ImGuiWindow* window = table->InnerWindow;
    table->CurrentColumn = column_n;

    // Start position is roughly ~~ CellRect.Min + CellPadding + Indent
    float start_x = column->WorkMinX;
    if (column->Flags & ImGuiTableColumnFlags_IndentEnable)
        start_x += table->RowIndentOffsetX; // ~~ += window.DC.Indent.x - table->HostIndentX, except we locked it for the row.

    window->DC.CursorPos.x = start_x;
    window->DC.CursorPos.y = table->RowPosY1 + table->CellPaddingY;
    window->DC.CursorMaxPos.x = window->DC.CursorPos.x;
    window->DC.ColumnsOffset.x = start_x - window->Pos.x - window->DC.Indent.x; // FIXME-WORKRECT
    window->DC.CurrLineTextBaseOffset = table->RowTextBaseline;
    window->DC.NavLayerCurrent = (ImGuiNavLayer)column->NavLayerCurrent;

    window->WorkRect.Min.y = window->DC.CursorPos.y;
    window->WorkRect.Min.x = column->WorkMinX;
    window->WorkRect.Max.x = column->WorkMaxX;
    window->DC.ItemWidth = column->ItemWidth;

    // To allow ImGuiListClipper to function we propagate our row height
    if (!column->IsEnabled)
        window->DC.CursorPos.y = ImMax(window->DC.CursorPos.y, table->RowPosY2);

    window->SkipItems = column->IsSkipItems;
    if (column->IsSkipItems)
    {
        ImGuiContext& g = *GImGui;
        g.LastItemData.ID = 0;
        g.LastItemData.StatusFlags = 0;
    }

    if (table->Flags & ImGuiTableFlags_NoClip)
    {
        // FIXME: if we end up drawing all borders/bg in EndTable, could remove this and just assert that channel hasn't changed.
        table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
        //IM_ASSERT(table->DrawSplitter._Current == TABLE_DRAW_CHANNEL_NOCLIP);
    }
    else
    {
        // FIXME-TABLE: Could avoid this if draw channel is dummy channel?
        SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
    }

    // Logging
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled && !column->IsSkipItems)
    {
        LogRenderedText(&window->DC.CursorPos, "|");
        g.LogLinePosY = FLT_MAX;
    }
}